

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts.c
# Opt level: O0

int uts_paramsToStr(char *strBuf,int ind)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double es;
  int m;
  double q;
  int ind_local;
  char *strBuf_local;
  
  pcVar3 = impl_getName();
  iVar1 = sprintf(strBuf + ind,"UTS - Unbalanced Tree Search %s (%s)\n","2.1",pcVar3);
  iVar2 = sprintf(strBuf + (iVar1 + ind),"Tree type:  %d (%s)\n",(ulong)type,uts_trees_str[type]);
  iVar2 = iVar2 + iVar1 + ind;
  iVar1 = sprintf(strBuf + iVar2,"Tree shape parameters:\n");
  iVar1 = iVar1 + iVar2;
  iVar2 = sprintf(strBuf + iVar1,"  root branching factor b_0 = %.1f, root seed = %d\n",b_0,
                  (ulong)(uint)rootId);
  q._4_4_ = iVar2 + iVar1;
  if ((type == GEO) || (type == HYBRID)) {
    iVar1 = sprintf(strBuf + q._4_4_,"  GEO parameters: gen_mx = %d, shape function = %d (%s)\n",
                    (ulong)(uint)gen_mx,(ulong)shape_fn,uts_geoshapes_str[shape_fn]);
    q._4_4_ = iVar1 + q._4_4_;
  }
  if ((type == BIN) || (type == HYBRID)) {
    iVar1 = sprintf(strBuf + q._4_4_,"  BIN parameters:  q = %f, m = %d, E(n) = %f, E(s) = %.2f\n",
                    nonLeafProb,nonLeafProb * (double)nonLeafBF,
                    1.0 / (-nonLeafProb * (double)nonLeafBF + 1.0),(ulong)(uint)nonLeafBF);
    q._4_4_ = iVar1 + q._4_4_;
  }
  if (type == HYBRID) {
    dVar5 = ceil(shiftDepth * (double)gen_mx);
    iVar1 = sprintf(strBuf + q._4_4_,"  HYBRID:  GEO from root to depth %d, then BIN\n",
                    (ulong)(uint)(int)dVar5);
    q._4_4_ = iVar1 + q._4_4_;
  }
  if (type == BALANCED) {
    iVar1 = sprintf(strBuf + q._4_4_,"  BALANCED parameters: gen_mx = %d\n",(ulong)(uint)gen_mx);
    dVar5 = pow(b_0,(double)(gen_mx + 1));
    dVar6 = (dVar5 - 1.0) / (b_0 - 1.0);
    uVar4 = (ulong)dVar6;
    dVar5 = pow(b_0,(double)gen_mx);
    iVar2 = sprintf(strBuf + (q._4_4_ + iVar1),"        Expected size: %llu nodes, %llu leaves\n",
                    uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f,
                    (long)dVar5 | (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f);
    q._4_4_ = iVar2 + q._4_4_ + iVar1;
  }
  iVar1 = sprintf(strBuf + q._4_4_,"Random number generator: ");
  iVar1 = rng_showtype(strBuf,iVar1 + q._4_4_);
  iVar2 = sprintf(strBuf + iVar1,"\nCompute granularity: %d\n",(ulong)(uint)computeGranularity);
  return iVar2 + iVar1;
}

Assistant:

int uts_paramsToStr(char *strBuf, int ind) {
  // version + execution model
  ind += sprintf(strBuf+ind, "UTS - Unbalanced Tree Search %s (%s)\n", UTS_VERSION, impl_getName());

  // tree type
  ind += sprintf(strBuf+ind, "Tree type:  %d (%s)\n", type, uts_trees_str[type]);
	
  // tree shape parameters
  ind += sprintf(strBuf+ind, "Tree shape parameters:\n");
  ind += sprintf(strBuf+ind, "  root branching factor b_0 = %.1f, root seed = %d\n", b_0, rootId);
	
  if (type == GEO || type == HYBRID) {
    ind += sprintf(strBuf+ind, "  GEO parameters: gen_mx = %d, shape function = %d (%s)\n", 
            gen_mx, shape_fn, uts_geoshapes_str[shape_fn]);
  }

  if (type == BIN || type == HYBRID) {
    double q = nonLeafProb;
    int    m = nonLeafBF;
    double es  = (1.0 / (1.0 - q * m));
    ind += sprintf(strBuf+ind, "  BIN parameters:  q = %f, m = %d, E(n) = %f, E(s) = %.2f\n",
            q, m, q * m, es);
  }

  if (type == HYBRID) {
    ind += sprintf(strBuf+ind, "  HYBRID:  GEO from root to depth %d, then BIN\n", 
            (int) ceil(shiftDepth * gen_mx));
  }
	
  if (type == BALANCED) {
    ind += sprintf(strBuf+ind, "  BALANCED parameters: gen_mx = %d\n", gen_mx);
    ind += sprintf(strBuf+ind, "        Expected size: %llu nodes, %llu leaves\n",
        (counter_t) ((pow(b_0, gen_mx+1) - 1.0)/(b_0 - 1.0)) /* geometric series */,
        (counter_t) pow(b_0, gen_mx));
  }
	
  // random number generator
  ind += sprintf(strBuf+ind, "Random number generator: ");
  ind  = rng_showtype(strBuf, ind);
  ind += sprintf(strBuf+ind, "\nCompute granularity: %d\n", computeGranularity);

  return ind;
}